

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorLinearSpeed::IntToDescriptor
          (ChLinkMotorLinearSpeed *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_40 [24];
  
  ChLinkMateGeneric::IntToDescriptor((ChLinkMateGeneric *)this,off_v,v,R,off_L,L,Qc);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)v,(ulong)off_v);
  dVar1 = *pdVar2;
  ChVariables::Get_qb((ChVectorRef *)local_40,&(this->variable).super_ChVariables);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_40,0,0);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)R,(ulong)off_v);
  dVar1 = *pdVar2;
  ChVariables::Get_fb((ChVectorRef *)local_40,&(this->variable).super_ChVariables);
  pSVar3 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_40,0,0);
  *pSVar3 = dVar1;
  return;
}

Assistant:

void ChLinkMotorLinearSpeed::IntToDescriptor(const unsigned int off_v,  // offset in v, R
                                             const ChStateDelta& v,
                                             const ChVectorDynamic<>& R,
                                             const unsigned int off_L,  // offset in L, Qc
                                             const ChVectorDynamic<>& L,
                                             const ChVectorDynamic<>& Qc) {
    // inherit parent
    ChLinkMotorLinear::IntToDescriptor(off_v, v, R, off_L, L, Qc);

    this->variable.Get_qb()(0, 0) = v(off_v);
    this->variable.Get_fb()(0, 0) = R(off_v);
}